

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O0

Ptr<RenderPass> myvk::RenderPass::Create(Ptr<Device> *device,VkRenderPassCreateInfo2 *create_info)

{
  PFN_vkCreateRenderPass2 p_Var1;
  VkResult VVar2;
  element_type *this;
  VkDevice pVVar3;
  element_type *peVar4;
  VkRenderPassCreateInfo2 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<RenderPass> PVar5;
  shared_ptr<myvk::RenderPass> ret;
  shared_ptr<myvk::Device> *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  std::make_shared<myvk::RenderPass>();
  std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cf193);
  std::shared_ptr<myvk::Device>::operator=
            ((shared_ptr<myvk::Device> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  p_Var1 = vkCreateRenderPass2;
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2cf1bd);
  pVVar3 = Device::GetHandle(this);
  peVar4 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2cf1df);
  VVar2 = (*p_Var1)(pVVar3,in_RDX,(VkAllocationCallbacks *)0x0,&peVar4->m_render_pass);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::RenderPass>::shared_ptr
              ((shared_ptr<myvk::RenderPass> *)(ulong)in_stack_ffffffffffffff90,
               (shared_ptr<myvk::RenderPass> *)in_RDX);
  }
  else {
    std::shared_ptr<myvk::RenderPass>::shared_ptr
              ((shared_ptr<myvk::RenderPass> *)CONCAT44(VVar2,in_stack_ffffffffffffff90),in_RDX);
  }
  std::shared_ptr<myvk::RenderPass>::~shared_ptr((shared_ptr<myvk::RenderPass> *)0x2cf25a);
  PVar5.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<RenderPass>)PVar5.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<RenderPass> RenderPass::Create(const Ptr<Device> &device, const VkRenderPassCreateInfo2 &create_info) {
	auto ret = std::make_shared<RenderPass>();
	ret->m_device_ptr = device;

	if (vkCreateRenderPass2(device->GetHandle(), &create_info, nullptr, &ret->m_render_pass) != VK_SUCCESS)
		return nullptr;
	return ret;
}